

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O0

scalar_function_t * duckdb::GetScalarIntegerFunction<duckdb::MultiplyOperator>(PhysicalType type)

{
  undefined8 uVar1;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **__f;
  char in_SIL;
  scalar_function_t *in_RDI;
  PhysicalType in_stack_0000000f;
  scalar_function_t *function;
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  *in_stack_ffffffffffffff20;
  allocator *paVar2;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  allocator local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  NotImplementedException *in_stack_ffffffffffffff90;
  
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
            (in_stack_ffffffffffffff20);
  __f = (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)(ulong)(byte)(in_SIL + 0x35);
  switch(__f) {
  case (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)0x0:
    ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
              ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
               CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),__f);
    break;
  case (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)0x1:
    ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
              ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
               CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),__f);
    break;
  default:
    uVar1 = __cxa_allocate_exception(0x10);
    paVar2 = &local_81;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff80,
               "Unimplemented type for GetScalarBinaryFunction: %s",paVar2);
    TypeIdToString_abi_cxx11_(in_stack_0000000f);
    NotImplementedException::NotImplementedException<std::__cxx11::string>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    __cxa_throw(uVar1,&NotImplementedException::typeinfo,
                NotImplementedException::~NotImplementedException);
  case (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)0x37:
    ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
              ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
               CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),__f);
    break;
  case (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)0x38:
    ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
              ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
               CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),__f);
    break;
  case (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)0x39:
    ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
              ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
               CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),__f);
    break;
  case (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)0x3a:
    ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
              ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
               CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),__f);
    break;
  case (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)0x3b:
    ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
              ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
               CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),__f);
    break;
  case (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)0x3c:
    ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
              ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
               CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),__f);
    break;
  case (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)0x3d:
    ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
              ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
               CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),__f);
    break;
  case (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)0x3e:
    ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
              ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
               CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),__f);
  }
  return in_RDI;
}

Assistant:

static scalar_function_t GetScalarIntegerFunction(PhysicalType type) {
	scalar_function_t function;
	switch (type) {
	case PhysicalType::INT8:
		function = &ScalarFunction::BinaryFunction<int8_t, int8_t, int8_t, OP>;
		break;
	case PhysicalType::INT16:
		function = &ScalarFunction::BinaryFunction<int16_t, int16_t, int16_t, OP>;
		break;
	case PhysicalType::INT32:
		function = &ScalarFunction::BinaryFunction<int32_t, int32_t, int32_t, OP>;
		break;
	case PhysicalType::INT64:
		function = &ScalarFunction::BinaryFunction<int64_t, int64_t, int64_t, OP>;
		break;
	case PhysicalType::INT128:
		function = &ScalarFunction::BinaryFunction<hugeint_t, hugeint_t, hugeint_t, OP>;
		break;
	case PhysicalType::UINT8:
		function = &ScalarFunction::BinaryFunction<uint8_t, uint8_t, uint8_t, OP>;
		break;
	case PhysicalType::UINT16:
		function = &ScalarFunction::BinaryFunction<uint16_t, uint16_t, uint16_t, OP>;
		break;
	case PhysicalType::UINT32:
		function = &ScalarFunction::BinaryFunction<uint32_t, uint32_t, uint32_t, OP>;
		break;
	case PhysicalType::UINT64:
		function = &ScalarFunction::BinaryFunction<uint64_t, uint64_t, uint64_t, OP>;
		break;
	case PhysicalType::UINT128:
		function = &ScalarFunction::BinaryFunction<uhugeint_t, uhugeint_t, uhugeint_t, OP>;
		break;
	default:
		throw NotImplementedException("Unimplemented type for GetScalarBinaryFunction: %s", TypeIdToString(type));
	}
	return function;
}